

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# receiver.hpp
# Opt level: O3

Sender<std::vector<std::__cxx11::basic_string<char>_>_> __thiscall
ftxui::
ReceiverImpl<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
::MakeSender(ReceiverImpl<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *this)

{
  long *plVar1;
  long in_RSI;
  unique_lock<std::mutex> lock;
  unique_lock<std::mutex> local_28;
  
  local_28._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_28);
  local_28._M_owns = true;
  LOCK();
  *(int *)(in_RSI + 0xa8) = *(int *)(in_RSI + 0xa8) + 1;
  UNLOCK();
  plVar1 = (long *)operator_new(8);
  *plVar1 = in_RSI;
  *(long **)&(this->mutex_).super___mutex_base._M_mutex = plVar1;
  std::unique_lock<std::mutex>::~unique_lock(&local_28);
  return (__uniq_ptr_data<ftxui::SenderImpl<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::default_delete<ftxui::SenderImpl<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_true,_true>
          )(__uniq_ptr_data<ftxui::SenderImpl<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::default_delete<ftxui::SenderImpl<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_true,_true>
            )this;
}

Assistant:

Sender<T> MakeSender() {
    std::unique_lock<std::mutex> lock(mutex_);
    senders_++;
    return std::unique_ptr<SenderImpl<T>>(new SenderImpl<T>(this));
  }